

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottieitem.cpp
# Opt level: O1

void __thiscall
rlottie::internal::renderer::SolidLayer::SolidLayer(SolidLayer *this,Layer *layerData)

{
  Layer::Layer(&this->super_Layer,layerData);
  (this->super_Layer)._vptr_Layer = (_func_int **)&PTR__SolidLayer_00145b98;
  VDrawable::VDrawable(&(this->mRenderNode).super_VDrawable,Fill);
  (this->mRenderNode).mCNode._M_t.super___uniq_ptr_impl<LOTNode,_std::default_delete<LOTNode>_>._M_t
  .super__Tuple_impl<0UL,_LOTNode_*,_std::default_delete<LOTNode>_>.
  super__Head_base<0UL,_LOTNode_*,_false>._M_head_impl = (LOTNode *)0x0;
  vcow_ptr<VPath::VPathData>::vcow_ptr(&(this->mPath).d);
  this->mDrawableList = &(this->mRenderNode).super_VDrawable;
  return;
}

Assistant:

renderer::SolidLayer::SolidLayer(model::Layer *layerData)
    : renderer::Layer(layerData)
{
    mDrawableList = &mRenderNode;
}